

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::ScriptWitness::SetWitnessStack(ScriptWitness *this,uint32_t index,ByteData *data)

{
  ByteData *pBVar1;
  size_type sVar2;
  CfdException *this_00;
  reference this_01;
  allocator local_59;
  string local_58;
  CfdSourceLocation local_38;
  ByteData *local_20;
  ByteData *data_local;
  ScriptWitness *pSStack_10;
  uint32_t index_local;
  ScriptWitness *this_local;
  
  local_20 = data;
  data_local._4_4_ = index;
  pSStack_10 = this;
  sVar2 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    (&this->witness_stack_);
  pBVar1 = local_20;
  if (sVar2 <= data_local._4_4_) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x32;
    local_38.funcname = "SetWitnessStack";
    logger::warn<unsigned_int&>
              (&local_38,"WitnessStack[{}] out_of_range.",(uint *)((long)&data_local + 4));
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_58,"vin out_of_range error.",&local_59);
    CfdException::CfdException(this_00,kCfdOutOfRangeError,&local_58);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  this_01 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                      (&this->witness_stack_,(ulong)data_local._4_4_);
  ByteData::operator=(this_01,pBVar1);
  return;
}

Assistant:

void ScriptWitness::SetWitnessStack(uint32_t index, const ByteData &data) {
  if (witness_stack_.size() <= index) {
    warn(CFD_LOG_SOURCE, "WitnessStack[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "vin out_of_range error.");
  }
  witness_stack_[index] = data;
}